

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopItemWidth(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  float *pfVar3;
  uint uVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  iVar1 = (pIVar2->DC).ItemWidthStack.Size;
  if (iVar1 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                  ,0x5d8,"void ImVector<float>::pop_back() [T = float]");
  }
  uVar4 = iVar1 - 1;
  (pIVar2->DC).ItemWidthStack.Size = uVar4;
  if (uVar4 == 0) {
    pfVar3 = &pIVar2->ItemWidthDefault;
  }
  else {
    if (iVar1 == 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                    ,0x5cc,"T &ImVector<float>::back() [T = float]");
    }
    pfVar3 = (pIVar2->DC).ItemWidthStack.Data + ((ulong)uVar4 - 1);
  }
  (pIVar2->DC).ItemWidth = *pfVar3;
  return;
}

Assistant:

void ImGui::PopItemWidth()
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ItemWidthStack.pop_back();
    window->DC.ItemWidth = window->DC.ItemWidthStack.empty() ? window->ItemWidthDefault : window->DC.ItemWidthStack.back();
}